

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseFlexBufferValue(Parser *this,Builder *builder)

{
  undefined1 *puVar1;
  pointer *ppVVar2;
  pointer pVVar3;
  pointer pVVar4;
  size_t len;
  anon_union_8_3_83789bcb_for_Value_0 *paVar5;
  double dVar6;
  char cVar7;
  int iVar8;
  int *piVar9;
  int64_t i;
  Builder *in_RDX;
  long lVar10;
  int t;
  char cVar11;
  CheckedError *ce;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  CheckedError ce_3;
  char *endptr;
  size_type __dnew;
  undefined1 local_6a [2];
  anon_union_8_3_83789bcb_for_Value_0 *local_68;
  size_t local_60;
  anon_union_8_3_83789bcb_for_Value_0 local_58 [2];
  ulong local_48;
  size_t local_40;
  pointer *local_38;
  
  iVar8 = *(int *)((long)&builder[0xb].string_pool._M_t._M_impl.super__Rb_tree_header._M_node_count
                  + 4);
  if (0x40 < iVar8) {
    __assert_fail("caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) && \"Check() must be called to prevent stack overflow\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x19d,"flatbuffers::Parser::ParseDepthGuard::ParseDepthGuard(Parser *)");
  }
  *(int *)((long)&builder[0xb].string_pool._M_t._M_impl.super__Rb_tree_header._M_node_count + 4) =
       iVar8 + 1;
  if (iVar8 == 0x40) {
    RecurseError(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (((ulong)(this->super_ParserState).prev_cursor_ & 1) != 0) goto LAB_0011bcab;
  }
  else {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
  }
  puVar1 = (undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1);
  iVar8 = *(int *)((long)&(builder->stack_).
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
  t = (int)builder;
  if (iVar8 < 0x7b) {
    if ((iVar8 != 0x2b) && (iVar8 != 0x2d)) {
      if (iVar8 == 0x5b) {
        pVVar3 = (in_RDX->stack_).
                 super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pVVar4 = (in_RDX->stack_).
                 super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          lVar10 = 0;
          do {
            bVar12 = lVar10 == 0;
            lVar10 = lVar10 + -1;
            if ((bVar12 || (~*(byte *)((long)&builder[6].stack_.
                                              super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 2
                                      ) & 1) != 0) &&
               (*(int *)((long)&(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) == 0x5d)) {
LAB_0011bb72:
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\x01') {
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                flexbuffers::Builder::EndVector(in_RDX,(long)pVVar3 - (long)pVVar4 >> 4,false,false)
                ;
                goto LAB_0011bca5;
              }
              break;
            }
            ParseFlexBufferValue(this,builder);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
            if (*(int *)((long)&(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) == 0x5d)
            goto LAB_0011bb72;
            if ((char)builder[8].key_pool._M_t._M_impl.super__Rb_tree_header._M_header._M_color ==
                _S_red) {
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              cVar7 = *(char *)&(this->super_ParserState).prev_cursor_;
              if (cVar7 == '\0') goto LAB_0011b67c;
            }
            else {
LAB_0011b67c:
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
              cVar7 = '\0';
            }
            *puVar1 = 1;
          } while (cVar7 == '\0');
        }
        *puVar1 = 1;
        goto LAB_0011bcab;
      }
      goto LAB_0011ba6e;
    }
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011bcab;
    if (*(int *)((long)&(builder->stack_).
                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4) == 0x104) {
      std::__cxx11::string::insert
                ((ulong)&(builder->stack_).
                         super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0,'\x01');
      ParseFlexBufferNumericConstant(this,builder);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011bcab;
      Next(this);
      goto LAB_0011bc9a;
    }
    local_48 = 0x20;
    local_68 = local_58;
    local_68 = (anon_union_8_3_83789bcb_for_Value_0 *)
               std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
    local_58[0].i_ = local_48;
    local_68[2] = (anon_union_8_3_83789bcb_for_Value_0)0x20746e6174736e6f;
    local_68[3] = (anon_union_8_3_83789bcb_for_Value_0)0x6465746365707865;
    *local_68 = (anon_union_8_3_83789bcb_for_Value_0)0x676e6974616f6c66;
    local_68[1] = (anon_union_8_3_83789bcb_for_Value_0)0x6320746e696f702d;
    local_60 = local_48;
    *(char *)((long)local_68 + local_48) = '\0';
    Error(this,(string *)builder);
    if (local_68 == local_58) goto LAB_0011bcab;
LAB_0011bb60:
    operator_delete(local_68,local_58[0].i_ + 1);
    goto LAB_0011bcab;
  }
  switch(iVar8) {
  case 0x101:
    len._0_1_ = builder->finished_;
    len._1_1_ = builder->has_duplicate_keys_;
    len._2_2_ = *(undefined2 *)&builder->field_0x32;
    len._4_4_ = builder->flags_;
    flexbuffers::Builder::String
              (in_RDX,(char *)(builder->stack_).
                              super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,len);
    Expect(this,t);
    break;
  case 0x102:
    paVar5 = &((builder->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0;
    if (paVar5 == (anon_union_8_3_83789bcb_for_Value_0 *)0x0) {
      __assert_fail("str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x11f,
                    "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = long]"
                   );
    }
    piVar9 = __errno_location();
    *piVar9 = 0;
    local_68 = paVar5;
    i = strtoll_l((char *)&paVar5->i_,(char **)&local_68,10,ClassicLocale::instance_);
    if (((local_68 == paVar5) || (*(char *)local_68 != '\0')) || (*piVar9 != 0)) {
      i = 0;
    }
    flexbuffers::Builder::Int(in_RDX,i);
    Expect(this,t);
    break;
  case 0x103:
    paVar5 = &((builder->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0;
    if (paVar5 == (anon_union_8_3_83789bcb_for_Value_0 *)0x0) {
      __assert_fail("str && val",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x138,
                    "bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = double]");
    }
    local_68 = paVar5;
    dVar6 = strtod_l((char *)&paVar5->i_,(char **)&local_68,ClassicLocale::instance_);
    uVar13 = 0;
    uVar14 = 0;
    if ((local_68 != paVar5) && (*(char *)local_68 == '\0')) {
      uVar13 = SUB84(dVar6,0);
      uVar14 = (undefined4)((ulong)dVar6 >> 0x20);
      if (NAN(dVar6)) {
        uVar13 = 0;
        uVar14 = 0x7ff80000;
      }
    }
    flexbuffers::Builder::Double(in_RDX,(double)CONCAT44(uVar14,uVar13));
    Expect(this,t);
    break;
  case 0x104:
    ppVVar2 = &(builder->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar8 = std::__cxx11::string::compare((char *)ppVVar2);
    if (iVar8 == 0) {
      flexbuffers::Builder::Bool(in_RDX,true);
      Next(this);
    }
    else {
      if (*(int *)((long)&(builder->stack_).
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104) {
LAB_0011ba6e:
        TokenError(this);
        goto LAB_0011bcab;
      }
      iVar8 = std::__cxx11::string::compare((char *)ppVVar2);
      if (iVar8 == 0) {
        flexbuffers::Builder::Bool(in_RDX,false);
        Next(this);
      }
      else {
        if (*(int *)((long)&(builder->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104)
        goto LAB_0011ba6e;
        iVar8 = std::__cxx11::string::compare((char *)ppVVar2);
        if (iVar8 == 0) {
          flexbuffers::Builder::Null(in_RDX);
          Next(this);
        }
        else {
          if ((*(int *)((long)&(builder->stack_).
                               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104) ||
             ((iVar8 = std::__cxx11::string::compare((char *)ppVVar2), iVar8 != 0 &&
              ((*(int *)((long)&(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104 ||
               ((iVar8 = std::__cxx11::string::compare((char *)ppVVar2), iVar8 != 0 &&
                ((*(int *)((long)&(builder->stack_).
                                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104 ||
                 (iVar8 = std::__cxx11::string::compare((char *)ppVVar2), iVar8 != 0))))))))))
          goto LAB_0011ba6e;
          ParseFlexBufferNumericConstant(this,builder);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011bcab;
          Next(this);
        }
      }
    }
    break;
  default:
    if (iVar8 != 0x7b) goto LAB_0011ba6e;
    pVVar3 = (in_RDX->stack_).
             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar4 = (in_RDX->stack_).
             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Expect((Parser *)local_6a,t);
    local_6a[1] = 1;
    if (local_6a[0] != '\0') {
LAB_0011b936:
      *(char *)&(this->super_ParserState).prev_cursor_ = local_6a[0];
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      goto LAB_0011bcab;
    }
    local_40 = (long)pVVar3 - (long)pVVar4 >> 4;
    local_38 = &(builder->stack_).
                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar10 = 0;
    do {
      if (((byte)(lVar10 == 0 |
                 *(byte *)((long)&builder[6].stack_.
                                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) ^ 1) == 1)
         && (*(int *)((long)&(builder->stack_).
                             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4) == 0x7d))
      goto LAB_0011b918;
      local_68 = local_58;
      local_60 = 0;
      local_58[0].u_ = local_58[0].u_ & 0xffffffffffffff00;
      std::__cxx11::string::_M_assign((string *)&local_68);
      if (*(int *)((long)&(builder->stack_).
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4) == 0x101) {
        Next((Parser *)local_6a);
      }
      else {
        Expect((Parser *)local_6a,t);
      }
      local_6a[1] = 1;
      cVar7 = local_6a[0];
      cVar11 = '\x01';
      if (local_6a[0] == '\0') {
        if (((char)builder[8].key_pool._M_t._M_impl.super__Rb_tree_header._M_header._M_color !=
             _S_black) ||
           ((*(uint *)((long)&(builder->stack_).
                              super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4) | 0x20) != 0x7b)) {
          Expect((Parser *)local_6a,t);
          local_6a[1] = 1;
          cVar7 = local_6a[0];
          cVar11 = '\x01';
          if (local_6a[0] != '\0') goto LAB_0011b8e9;
        }
        flexbuffers::Builder::Key(in_RDX,(char *)&local_68->i_,local_60);
        ParseFlexBufferValue((Parser *)local_6a,builder);
        if (local_6a[0] == '\x01') {
          local_6a = (undefined1  [2])0x101;
          cVar7 = '\x01';
          cVar11 = '\x01';
        }
        else {
          lVar10 = lVar10 + 1;
          local_6a = (undefined1  [2])0x100;
          if (*(int *)((long)&(builder->stack_).
                              super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4) == 0x7d) {
            cVar7 = '\0';
            cVar11 = '\x02';
          }
          else {
            if ((char)builder[8].key_pool._M_t._M_impl.super__Rb_tree_header._M_header._M_color ==
                _S_red) {
              Expect((Parser *)local_6a,t);
              cVar7 = local_6a[0];
              if (local_6a[0] == '\0') goto LAB_0011b8d9;
            }
            else {
LAB_0011b8d9:
              local_6a = (undefined1  [2])0x0;
              cVar7 = '\0';
            }
            local_6a[1] = 1;
            cVar11 = cVar7;
          }
        }
      }
LAB_0011b8e9:
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0].i_ + 1);
      }
    } while (cVar11 == '\0');
    if (cVar11 == '\x02') {
LAB_0011b918:
      Next((Parser *)local_6a);
      if (local_6a[0] != '\0') goto LAB_0011b936;
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
    }
    else {
      *(char *)&(this->super_ParserState).prev_cursor_ = cVar7;
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (cVar7 != '\0') goto LAB_0011bcab;
    }
    flexbuffers::Builder::EndMap(in_RDX,local_40);
    if (in_RDX->has_duplicate_keys_ == true) {
      local_68 = local_58;
      local_48 = 0x22;
      local_68 = (anon_union_8_3_83789bcb_for_Value_0 *)
                 std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
      local_58[0].i_ = local_48;
      local_68[2] = (anon_union_8_3_83789bcb_for_Value_0)0x6c70756420736168;
      local_68[3] = (anon_union_8_3_83789bcb_for_Value_0)0x656b206574616369;
      *local_68 = (anon_union_8_3_83789bcb_for_Value_0)0x6666754278656c46;
      local_68[1] = (anon_union_8_3_83789bcb_for_Value_0)0x2070616d20737265;
      *(undefined2 *)(local_68 + 4) = 0x7379;
      local_60 = local_48;
      *(char *)((long)local_68 + local_48) = '\0';
      Error(this,(string *)builder);
      if (local_68 == local_58) goto LAB_0011bcab;
      goto LAB_0011bb60;
    }
    goto LAB_0011bca5;
  }
LAB_0011bc9a:
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
LAB_0011bca5:
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_0011bcab:
  piVar9 = (int *)((long)&builder[0xb].string_pool._M_t._M_impl.super__Rb_tree_header._M_node_count
                  + 4);
  *piVar9 = *piVar9 + -1;
  return SUB82(this,0);
}

Assistant:

explicit ParseDepthGuard(Parser *parser_not_null)
      : parser_(*parser_not_null), caller_depth_(parser_.parse_depth_counter_) {
    FLATBUFFERS_ASSERT(caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) &&
                       "Check() must be called to prevent stack overflow");
    parser_.parse_depth_counter_ += 1;
  }